

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O2

int fsg_model_word_id(fsg_model_t *fsg,char *word)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = fsg->n_word;
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  do {
    if (uVar5 == uVar4) {
LAB_0012b597:
      uVar3 = 0xffffffff;
      if ((uint)uVar5 != uVar1) {
        uVar3 = (uint)uVar5;
      }
      return uVar3;
    }
    iVar2 = strcmp(fsg->vocab[uVar4],word);
    if (iVar2 == 0) {
      uVar5 = uVar4 & 0xffffffff;
      goto LAB_0012b597;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int
fsg_model_word_id(fsg_model_t * fsg, char const *word)
{
    int wid;

    /* Search for an existing word matching this. */
    for (wid = 0; wid < fsg->n_word; ++wid) {
        if (0 == strcmp(fsg->vocab[wid], word))
            break;
    }
    /* If not found, add this to the vocab. */
    if (wid == fsg->n_word)
        return -1;
    return wid;
}